

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

Flag<TestConfig> *
anon_unknown.dwarf_4a080::CredentialFlag
          (Flag<TestConfig> *__return_storage_ptr__,Flag<CredentialConfig> *flag)

{
  undefined2 uVar1;
  char *pcVar2;
  undefined8 *puVar3;
  _Any_data local_30;
  code *local_20;
  undefined8 uStack_18;
  
  __return_storage_ptr__->name = flag->name;
  __return_storage_ptr__->has_param = flag->has_param;
  __return_storage_ptr__->skip_handshaker = false;
  uVar1 = *(undefined2 *)&flag->has_param;
  pcVar2 = flag->name;
  std::function<bool_(CredentialConfig_*,_const_char_*)>::function
            ((function<bool_(CredentialConfig_*,_const_char_*)> *)&local_30,&flag->set_param);
  (__return_storage_ptr__->set_param).super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->set_param)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->set_param).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->set_param).super__Function_base._M_functor + 8) =
       0;
  puVar3 = (undefined8 *)operator_new(0x30);
  *(undefined2 *)(puVar3 + 1) = uVar1;
  *puVar3 = pcVar2;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = uStack_18;
  if (local_20 != (code *)0x0) {
    puVar3[2] = local_30._M_unused._M_object;
    puVar3[3] = local_30._8_8_;
    puVar3[4] = local_20;
    local_20 = (code *)0x0;
    uStack_18 = 0;
  }
  *(undefined8 **)&(__return_storage_ptr__->set_param).super__Function_base._M_functor = puVar3;
  (__return_storage_ptr__->set_param)._M_invoker =
       std::
       _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:289:27)>
       ::_M_invoke;
  (__return_storage_ptr__->set_param).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:289:27)>
       ::_M_manager;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

Flag<TestConfig> CredentialFlag(Flag<CredentialConfig> flag) {
  return Flag<TestConfig>{flag.name, flag.has_param, /*skip_handshaker=*/false,
                          [=](TestConfig *config, const char *param) -> bool {
                            if (config->credentials.empty()) {
                              fprintf(stderr, "No credentials configured.\n");
                              return false;
                            }
                            return flag.set_param(&config->credentials.back(),
                                                  param);
                          }};
}